

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O1

int loader_impl_load_from_file
              (plugin_manager manager,plugin p,loader_impl impl,loader_path *paths,size_t size,
              void **handle_ptr)

{
  bool bVar1;
  int iVar2;
  loader_impl_interface iface;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  loader_handle module;
  undefined8 *puVar6;
  ulong uVar7;
  loader_handle_impl handle_impl;
  loader_path path;
  loader_handle_impl local_1048;
  void **local_1040;
  char local_1038 [4104];
  
  if (impl == (loader_impl)0x0) {
    return 1;
  }
  local_1040 = handle_ptr;
  iface = (loader_impl_interface)plugin_iface(p);
  if (iface == (loader_impl_interface)0x0) {
    bVar1 = true;
  }
  else {
    iVar2 = loader_impl_initialize(manager,p,impl);
    p = (plugin)0x1;
    if (iVar2 == 0) {
      sVar3 = loader_impl_handle_name(manager,*paths,local_1038);
      if ((sVar3 < 2) || (lVar4 = set_get(impl->handle_impl_path_map,local_1038), lVar4 == 0)) {
        uVar5 = vector_size(impl->handle_impl_init_order);
        vector_push_back_empty(impl->handle_impl_init_order);
        module = (*iface->load_from_file)(impl,paths,size);
        if (module == (loader_handle)0x0) {
          while( true ) {
            uVar5 = uVar5 + 1;
            uVar7 = vector_size(impl->handle_impl_init_order);
            if (uVar7 <= uVar5) break;
            puVar6 = (undefined8 *)vector_at(impl->handle_impl_init_order,uVar5);
            loader_impl_destroy_handle((loader_handle_impl)*puVar6);
          }
          vector_pop_back(impl->handle_impl_init_order);
        }
        else {
          local_1048 = loader_impl_load_handle(impl,iface,module,local_1038,0x1000);
          if (local_1048 != (loader_handle_impl)0x0) {
            local_1048->populated = 1;
            iVar2 = set_insert(impl->handle_impl_path_map,local_1048->path,local_1048);
            if (iVar2 == 0) {
              iVar2 = set_insert(impl->handle_impl_map,local_1048->module);
              if (iVar2 == 0) {
                iVar2 = (*iface->discover)(impl,local_1048->module,local_1048->ctx);
                if ((iVar2 == 0) &&
                   (iVar2 = loader_impl_handle_register
                                      (manager,impl,local_1038,local_1048,local_1040), iVar2 == 0))
                {
                  vector_set(impl->handle_impl_init_order,uVar5,&local_1048);
                  bVar1 = false;
                  p = (plugin)0x0;
                  goto LAB_00106468;
                }
                set_remove(impl->handle_impl_map,local_1048->module);
              }
              set_remove(impl->handle_impl_path_map,local_1048->path);
            }
            while( true ) {
              uVar5 = uVar5 + 1;
              uVar7 = vector_size(impl->handle_impl_init_order);
              if (uVar7 <= uVar5) break;
              puVar6 = (undefined8 *)vector_at(impl->handle_impl_init_order,uVar5);
              loader_impl_destroy_handle((loader_handle_impl)*puVar6);
            }
            vector_pop_back(impl->handle_impl_init_order);
            log_write_impl_va("metacall",0x3b5,"loader_impl_load_from_file",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                              ,3,"Error when loading handle: %s",local_1038);
            loader_impl_destroy_handle(local_1048);
          }
        }
        p = (plugin)0x0;
        bVar1 = true;
      }
      else {
        bVar1 = false;
        log_write_impl_va("metacall",0x37b,"loader_impl_load_from_file",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,3,"Load from file handle failed, handle with name %s already loaded",
                          local_1038);
      }
    }
    else {
      bVar1 = false;
    }
  }
LAB_00106468:
  if (bVar1) {
    return 1;
  }
  return (int)p;
}

Assistant:

int loader_impl_load_from_file(plugin_manager manager, plugin p, loader_impl impl, const loader_path paths[], size_t size, void **handle_ptr)
{
	if (impl != NULL)
	{
		loader_impl_interface iface = loader_iface(p);

		/* TODO: Disable logs here until log is completely thread safe and async signal safe */
		/*
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			log_write("metacall", LOG_LEVEL_DEBUG, "Loading %s", paths[iterator]);
		}
		*/

		if (iface != NULL)
		{
			loader_handle handle;
			loader_path path;
			size_t init_order;

			if (loader_impl_initialize(manager, p, impl) != 0)
			{
				return 1;
			}

			if (loader_impl_handle_name(manager, paths[0], path) > 1 && loader_impl_get_handle(impl, path) != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Load from file handle failed, handle with name %s already loaded", path);

				return 1;
			}

			init_order = vector_size(impl->handle_impl_init_order);

			vector_push_back_empty(impl->handle_impl_init_order);

			handle = iface->load_from_file(impl, paths, size);

			/* TODO: Disable logs here until log is completely thread safe and async signal safe */
			/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader interface: %p - Loader handle: %p", (void *)iface, (void *)handle); */

			if (handle != NULL)
			{
				loader_handle_impl handle_impl = loader_impl_load_handle(impl, iface, handle, path, LOADER_PATH_SIZE);

				/* TODO: Disable logs here until log is completely thread safe and async signal safe */
				/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader handle impl: %p", (void *)handle_impl); */

				if (handle_impl != NULL)
				{
					handle_impl->populated = 1;

					if (set_insert(impl->handle_impl_path_map, handle_impl->path, handle_impl) == 0)
					{
						if (set_insert(impl->handle_impl_map, handle_impl->module, handle_impl) == 0)
						{
							if (iface->discover(impl, handle_impl->module, handle_impl->ctx) == 0)
							{
								if (loader_impl_handle_register(manager, impl, path, handle_impl, handle_ptr) == 0)
								{
									vector_set_var(impl->handle_impl_init_order, init_order, handle_impl);

									return 0;
								}
							}

							set_remove(impl->handle_impl_map, handle_impl->module);
						}

						set_remove(impl->handle_impl_path_map, handle_impl->path);
					}

					{
						size_t iterator;

						for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
						{
							loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

							loader_impl_destroy_handle(iterator_handle_impl);
						}

						vector_pop_back(impl->handle_impl_init_order);
					}

					log_write("metacall", LOG_LEVEL_ERROR, "Error when loading handle: %s", path);

					loader_impl_destroy_handle(handle_impl);
				}
			}
			else
			{
				size_t iterator;

				for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
				{
					loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

					loader_impl_destroy_handle(iterator_handle_impl);
				}

				vector_pop_back(impl->handle_impl_init_order);
			}
		}
	}

	return 1;
}